

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableLazyMessageFieldGenerator::GenerateBuilderMembers
          (RepeatedImmutableLazyMessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_RepeatedImmutableMessageFieldGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "private java.util.List<com.google.protobuf.LazyFieldLite> $name$_ =\n  java.util.Collections.emptyList();\nprivate void ensure$capitalized_name$IsMutable() {\n  if (!$get_mutable_bit_builder$) {\n    $name$_ =\n        new java.util.ArrayList<com.google.protobuf.LazyFieldLite>(\n            $name$_);\n    $set_mutable_bit_builder$;\n   }\n}\n\n"
                    );
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.RepeatedFieldBuilder$ver$<\n    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;\n\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public java.util.List<$type$> get$capitalized_name$List()",
             "java.util.List<$type$> list =\n    new java.util.ArrayList<$type$>($name$_.size());\nfor (com.google.protobuf.LazyFieldLite lf : $name$_) {\n  list.add(($type$) lf.getValue($type$.getDefaultInstance()));\n}\nreturn java.util.Collections.unmodifiableList(list);\n"
             ,"return $name$Builder_.getMessageList();\n",(char *)0x0);
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public int get$capitalized_name$Count()","return $name$_.size();\n",
             "return $name$Builder_.getCount();\n",(char *)0x0);
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public $type$ get$capitalized_name$(int index)",
             "return ($type$) $name$_.get(index).getValue(\n    $type$.getDefaultInstance());\n",
             "return $name$Builder_.getMessage(index);\n",(char *)0x0);
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder set$capitalized_name$(\n    int index, $type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\nensure$capitalized_name$IsMutable();\n$name$_.set(index, com.google.protobuf.LazyFieldLite.fromValue(value));\n$on_changed$\n"
             ,"$name$Builder_.setMessage(index, value);\n","return this;\n");
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder set$capitalized_name$(\n    int index, $type$.Builder builderForValue)"
             ,
             "ensure$capitalized_name$IsMutable();\n$name$_.set(index, com.google.protobuf.LazyFieldLite.fromValue(\n    builderForValue.build()));\n$on_changed$\n"
             ,"$name$Builder_.setMessage(index, builderForValue.build());\n","return this;\n");
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder add$capitalized_name$($type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\nensure$capitalized_name$IsMutable();\n$name$_.add(com.google.protobuf.LazyFieldLite.fromValue(value));\n$on_changed$\n"
             ,"$name$Builder_.addMessage(value);\n","return this;\n");
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder add$capitalized_name$(\n    int index, $type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\nensure$capitalized_name$IsMutable();\n$name$_.add(index, com.google.protobuf.LazyFieldLite.fromValue(value));\n$on_changed$\n"
             ,"$name$Builder_.addMessage(index, value);\n","return this;\n");
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder add$capitalized_name$(\n    $type$.Builder builderForValue)"
             ,
             "ensure$capitalized_name$IsMutable();\n$name$_.add(com.google.protobuf.LazyFieldLite.fromValue(\n    builderForValue.build()));\n$on_changed$\n"
             ,"$name$Builder_.addMessage(builderForValue.build());\n","return this;\n");
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder add$capitalized_name$(\n    int index, $type$.Builder builderForValue)"
             ,
             "ensure$capitalized_name$IsMutable();\n$name$_.add(index, com.google.protobuf.LazyFieldLite.fromValue(\n    builderForValue.build()));\n$on_changed$\n"
             ,"$name$Builder_.addMessage(index, builderForValue.build());\n","return this;\n");
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder addAll$capitalized_name$(\n    java.lang.Iterable<? extends $type$> values)"
             ,
             "ensure$capitalized_name$IsMutable();\nfor (com.google.protobuf.MessageLite v : values) {\n  $name$_.add(com.google.protobuf.LazyFieldLite.fromValue(v));\n}\n$on_changed$\n"
             ,"$name$Builder_.addAllMessages(values);\n","return this;\n");
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder clear$capitalized_name$()",
             "$name$_ = java.util.Collections.emptyList();\n$clear_mutable_bit_builder$;\n$on_changed$\n"
             ,"$name$Builder_.clear();\n","return this;\n");
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  RepeatedImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            (&this->super_RepeatedImmutableMessageFieldGenerator,printer,
             "$deprecation$public Builder remove$capitalized_name$(int index)",
             "ensure$capitalized_name$IsMutable();\n$name$_.remove(index);\n$on_changed$\n",
             "$name$Builder_.remove(index);\n","return this;\n");
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$.Builder get$capitalized_name$Builder(\n    int index) {\n  return get$capitalized_name$FieldBuilder().getBuilder(index);\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder(\n    int index) {\n  if ($name$Builder_ == null) {\n    return $name$_.get(index);  } else {\n    return $name$Builder_.getMessageOrBuilder(index);\n  }\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<? extends $type$OrBuilder> \n     get$capitalized_name$OrBuilderList() {\n  if ($name$Builder_ != null) {\n    return $name$Builder_.getMessageOrBuilderList();\n  } else {\n    return java.util.Collections.unmodifiableList($name$_);\n  }\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$.Builder add$capitalized_name$Builder() {\n  return get$capitalized_name$FieldBuilder().addBuilder(\n      $type$.getDefaultInstance());\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$.Builder add$capitalized_name$Builder(\n    int index) {\n  return get$capitalized_name$FieldBuilder().addBuilder(\n      index, $type$.getDefaultInstance());\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<$type$.Builder> \n     get$capitalized_name$BuilderList() {\n  return get$capitalized_name$FieldBuilder().getBuilderList();\n}\nprivate com.google.protobuf.RepeatedFieldBuilder$ver$<\n    $type$, $type$.Builder, $type$OrBuilder> \n    get$capitalized_name$FieldBuilder() {\n  if ($name$Builder_ == null) {\n    $name$Builder_ = new com.google.protobuf.RepeatedFieldBuilder$ver$<\n        $type$, $type$.Builder, $type$OrBuilder>(\n            $name$_,\n            $get_mutable_bit_builder$,\n            getParentForChildren(),\n            isClean());\n    $name$_ = null;\n  }\n  return $name$Builder_;\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableLazyMessageFieldGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  // When using nested-builders, the code initially works just like the
  // non-nested builder case. It only creates a nested builder lazily on
  // demand and then forever delegates to it after creation.

  printer->Print(variables_,
    "private java.util.List<com.google.protobuf.LazyFieldLite> $name$_ =\n"
    "  java.util.Collections.emptyList();\n"

    "private void ensure$capitalized_name$IsMutable() {\n"
    "  if (!$get_mutable_bit_builder$) {\n"
    "    $name$_ =\n"
    "        new java.util.ArrayList<com.google.protobuf.LazyFieldLite>(\n"
    "            $name$_);\n"
    "    $set_mutable_bit_builder$;\n"
    "   }\n"
    "}\n"
    "\n");

  printer->Print(variables_,
    // If this builder is non-null, it is used and the other fields are
    // ignored.
    "private com.google.protobuf.RepeatedFieldBuilder$ver$<\n"
    "    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;\n"
    "\n");

  // The comments above the methods below are based on a hypothetical
  // repeated field of type "Field" called "RepeatedField".

  // List<Field> getRepeatedFieldList()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public java.util.List<$type$> get$capitalized_name$List()",

    "java.util.List<$type$> list =\n"
    "    new java.util.ArrayList<$type$>($name$_.size());\n"
    "for (com.google.protobuf.LazyFieldLite lf : $name$_) {\n"
    "  list.add(($type$) lf.getValue($type$.getDefaultInstance()));\n"
    "}\n"
    "return java.util.Collections.unmodifiableList(list);\n",

    "return $name$Builder_.getMessageList();\n",

    NULL);

  // int getRepeatedFieldCount()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public int get$capitalized_name$Count()",

    "return $name$_.size();\n",
    "return $name$Builder_.getCount();\n",

    NULL);

  // Field getRepeatedField(int index)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public $type$ get$capitalized_name$(int index)",

    "return ($type$) $name$_.get(index).getValue(\n"
    "    $type$.getDefaultInstance());\n",

    "return $name$Builder_.getMessage(index);\n",

    NULL);

  // Builder setRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    int index, $type$ value)",
    "if (value == null) {\n"
    "  throw new NullPointerException();\n"
    "}\n"
    "ensure$capitalized_name$IsMutable();\n"
    "$name$_.set(index, com.google.protobuf.LazyFieldLite.fromValue(value));\n"
    "$on_changed$\n",
    "$name$Builder_.setMessage(index, value);\n",
    "return this;\n");

  // Builder setRepeatedField(int index, Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    int index, $type$.Builder builderForValue)",

    "ensure$capitalized_name$IsMutable();\n"
    "$name$_.set(index, com.google.protobuf.LazyFieldLite.fromValue(\n"
    "    builderForValue.build()));\n"
    "$on_changed$\n",

    "$name$Builder_.setMessage(index, builderForValue.build());\n",

    "return this;\n");

  // Builder addRepeatedField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder add$capitalized_name$($type$ value)",

    "if (value == null) {\n"
    "  throw new NullPointerException();\n"
    "}\n"
    "ensure$capitalized_name$IsMutable();\n"
    "$name$_.add(com.google.protobuf.LazyFieldLite.fromValue(value));\n"

    "$on_changed$\n",

    "$name$Builder_.addMessage(value);\n",

    "return this;\n");

  // Builder addRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder add$capitalized_name$(\n"
    "    int index, $type$ value)",

    "if (value == null) {\n"
    "  throw new NullPointerException();\n"
    "}\n"
    "ensure$capitalized_name$IsMutable();\n"
    "$name$_.add(index, com.google.protobuf.LazyFieldLite.fromValue(value));\n"
    "$on_changed$\n",

    "$name$Builder_.addMessage(index, value);\n",

    "return this;\n");

  // Builder addRepeatedField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder add$capitalized_name$(\n"
    "    $type$.Builder builderForValue)",

    "ensure$capitalized_name$IsMutable();\n"
    "$name$_.add(com.google.protobuf.LazyFieldLite.fromValue(\n"
    "    builderForValue.build()));\n"
    "$on_changed$\n",

    "$name$Builder_.addMessage(builderForValue.build());\n",

    "return this;\n");

  // Builder addRepeatedField(int index, Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder add$capitalized_name$(\n"
    "    int index, $type$.Builder builderForValue)",

    "ensure$capitalized_name$IsMutable();\n"
    "$name$_.add(index, com.google.protobuf.LazyFieldLite.fromValue(\n"
    "    builderForValue.build()));\n"
    "$on_changed$\n",

    "$name$Builder_.addMessage(index, builderForValue.build());\n",

    "return this;\n");

  // Builder addAllRepeatedField(Iterable<Field> values)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder addAll$capitalized_name$(\n"
    "    java.lang.Iterable<? extends $type$> values)",

    "ensure$capitalized_name$IsMutable();\n"
    "for (com.google.protobuf.MessageLite v : values) {\n"
    "  $name$_.add(com.google.protobuf.LazyFieldLite.fromValue(v));\n"
    "}\n"
    "$on_changed$\n",

    "$name$Builder_.addAllMessages(values);\n",

    "return this;\n");

  // Builder clearAllRepeatedField()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder clear$capitalized_name$()",

    "$name$_ = java.util.Collections.emptyList();\n"
    "$clear_mutable_bit_builder$;\n"
    "$on_changed$\n",

    "$name$Builder_.clear();\n",

    "return this;\n");

  // Builder removeRepeatedField(int index)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder remove$capitalized_name$(int index)",

    "ensure$capitalized_name$IsMutable();\n"
    "$name$_.remove(index);\n"
    "$on_changed$\n",

    "$name$Builder_.remove(index);\n",

    "return this;\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$.Builder get$capitalized_name$Builder(\n"
    "    int index) {\n"
    "  return get$capitalized_name$FieldBuilder().getBuilder(index);\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
      printer->Print(variables_,
    "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder(\n"
    "    int index) {\n"
    "  if ($name$Builder_ == null) {\n"
    "    return $name$_.get(index);"
    "  } else {\n"
    "    return $name$Builder_.getMessageOrBuilder(index);\n"
    "  }\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
      printer->Print(variables_,
    "$deprecation$public java.util.List<? extends $type$OrBuilder> \n"
    "     get$capitalized_name$OrBuilderList() {\n"
    "  if ($name$Builder_ != null) {\n"
    "    return $name$Builder_.getMessageOrBuilderList();\n"
    "  } else {\n"
    "    return java.util.Collections.unmodifiableList($name$_);\n"
    "  }\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
      printer->Print(variables_,
    "$deprecation$public $type$.Builder add$capitalized_name$Builder() {\n"
    "  return get$capitalized_name$FieldBuilder().addBuilder(\n"
    "      $type$.getDefaultInstance());\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
      printer->Print(variables_,
    "$deprecation$public $type$.Builder add$capitalized_name$Builder(\n"
    "    int index) {\n"
    "  return get$capitalized_name$FieldBuilder().addBuilder(\n"
    "      index, $type$.getDefaultInstance());\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
      printer->Print(variables_,
    "$deprecation$public java.util.List<$type$.Builder> \n"
    "     get$capitalized_name$BuilderList() {\n"
    "  return get$capitalized_name$FieldBuilder().getBuilderList();\n"
    "}\n"
    "private com.google.protobuf.RepeatedFieldBuilder$ver$<\n"
    "    $type$, $type$.Builder, $type$OrBuilder> \n"
    "    get$capitalized_name$FieldBuilder() {\n"
    "  if ($name$Builder_ == null) {\n"
    "    $name$Builder_ = new com.google.protobuf.RepeatedFieldBuilder$ver$<\n"
    "        $type$, $type$.Builder, $type$OrBuilder>(\n"
    "            $name$_,\n"
    "            $get_mutable_bit_builder$,\n"
    "            getParentForChildren(),\n"
    "            isClean());\n"
    "    $name$_ = null;\n"
    "  }\n"
    "  return $name$Builder_;\n"
    "}\n");
}